

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

void __thiscall
xsettingsd::SettingsManager::SetPropertyOnWindow
          (SettingsManager *this,Window win,char *data,size_t size)

{
  size_t size_local;
  char *data_local;
  Window win_local;
  SettingsManager *this_local;
  
  XChangeProperty(this->display_,win,this->prop_atom_,this->prop_atom_,8,0,data,(int)size);
  return;
}

Assistant:

void SettingsManager::SetPropertyOnWindow(
    Window win, const char* data, size_t size) {
  XChangeProperty(display_,
                  win,
                  prop_atom_,  // property
                  prop_atom_,  // type
                  8,           // format (bits per element)
                  PropModeReplace,
                  reinterpret_cast<const unsigned char*>(data),
                  size);
}